

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawpagetexture.cpp
# Opt level: O2

BYTE * __thiscall FRawPageTexture::GetColumn(FRawPageTexture *this,uint column,Span **spans_out)

{
  ushort uVar1;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  uVar1 = (this->super_FTexture).Width;
  if (spans_out != (Span **)0x0) {
    *spans_out = DummySpans;
  }
  if (uVar1 <= column) {
    column = column % 0x140;
  }
  return this->Pixels + (this->super_FTexture).Height * column;
}

Assistant:

const BYTE *FRawPageTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if ((unsigned)column >= (unsigned)Width)
	{
		column %= 320;
	}
	if (spans_out != NULL)
	{
		*spans_out = DummySpans;
	}
	return Pixels + column*Height;
}